

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubRoutineLocArrays::~SubRoutineLocArrays(SubRoutineLocArrays *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{

		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));
		return doRun(subroutineUniforms);
	}